

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int ncnn::binary_op_no_broadcast<ncnn::binary_op_sub>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  
  iVar1 = a->c;
  if (0 < (long)iVar1) {
    uVar8 = a->h * a->w * a->d;
    pvVar12 = a->data;
    sVar2 = a->cstep;
    pvVar13 = b->data;
    sVar3 = b->cstep;
    pvVar9 = c->data;
    sVar4 = c->cstep;
    sVar5 = c->elemsize;
    sVar6 = b->elemsize;
    sVar7 = a->elemsize;
    lVar10 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar11 = 0;
        do {
          *(float *)((long)pvVar9 + uVar11 * 4) =
               *(float *)((long)pvVar12 + uVar11 * 4) - *(float *)((long)pvVar13 + uVar11 * 4);
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      lVar10 = lVar10 + 1;
      pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar5);
      pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar6);
      pvVar12 = (void *)((long)pvVar12 + sVar2 * sVar7);
    } while (lVar10 != iVar1);
  }
  return iVar1;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], ptr1[i]);
        }
    }

    return 0;
}